

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::GenerateViolationsReport
          (SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,SolCheck *chk,bool param_2)

{
  bool bVar1;
  allocator<char> local_279;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  MemoryWriter wrt;
  
  wrt.super_BasicWriter<char>.buffer_ = &wrt.buffer_.super_Buffer<char>;
  wrt.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_003993a0;
  wrt.buffer_.super_Buffer<char>.ptr_ = wrt.buffer_.data_;
  wrt.buffer_.super_Buffer<char>.size_ = 0;
  wrt.buffer_.super_Buffer<char>.capacity_ = 500;
  wrt.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_003993e8;
  bVar1 = SolCheck::HasAnyConViols(chk);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"variable bounds",&local_279);
    Gen1Viol(this,(chk->viol_var_bnds_)._M_elems,&wrt,true,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"aux var bounds",&local_279);
    Gen1Viol(this,(chk->viol_var_bnds_)._M_elems + 1,&wrt,true,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"variable integrality",&local_279);
    Gen1Viol(this,(chk->viol_var_int_)._M_elems,&wrt,true,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"aux var integrality",&local_279);
    Gen1Viol(this,(chk->viol_var_int_)._M_elems + 1,&wrt,true,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
  }
  GenConViol(this,&chk->viol_cons_alg_,&wrt,0);
  GenConViol(this,&chk->viol_cons_log_,&wrt,1);
  if ((chk->viol_obj_).N_ != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"objective(s)",&local_279);
    Gen1Viol(this,&chk->viol_obj_,&wrt,true,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
  }
  fmt::BasicWriter<char>::str_abi_cxx11_(&local_258,&wrt.super_BasicWriter<char>);
  std::__cxx11::string::operator=((string *)&chk->report_,(string *)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&wrt);
  return;
}

Assistant:

void GenerateViolationsReport(
      SolCheck& chk, bool ) {
    fmt::MemoryWriter wrt;
    if (chk.HasAnyConViols()) {
      Gen1Viol(chk.VarViolBnds().at(0), wrt, true,
               "variable bounds");
      Gen1Viol(chk.VarViolBnds().at(1), wrt, true,
               "aux var bounds");
      Gen1Viol(chk.VarViolIntty().at(0), wrt, true,
               "variable integrality");
      Gen1Viol(chk.VarViolIntty().at(1), wrt, true,
               "aux var integrality");
    }
    GenConViol(chk.ConViolAlg(), wrt, 0);
    GenConViol(chk.ConViolLog(), wrt, 1);
    if (chk.HasAnyObjViols()) {
      Gen1Viol(chk.ObjViols(), wrt, true,
               "objective(s)");
    }
    chk.SetReport( wrt.str() );
  }